

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-multiple-listen.c
# Opt level: O2

int run_test_multiple_listen(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  long lVar4;
  char *__format;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int64_t eval_a;
  int64_t eval_b;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar5 = "r";
      uVar2 = 0x36;
      goto LAB_0015b742;
    }
    iVar1 = uv_tcp_bind(&server,&addr,0);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar5 = "r";
      uVar2 = 0x39;
      goto LAB_0015b742;
    }
    iVar1 = uv_listen(&server,0x80,connection_cb);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar5 = "r";
      uVar2 = 0x3c;
      goto LAB_0015b742;
    }
    iVar1 = uv_listen(&server,0x80,connection_cb);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar5 = "r";
      uVar2 = 0x3f;
      goto LAB_0015b742;
    }
    pvVar3 = malloc(0x68);
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar5 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
      uVar2 = 0x51;
      goto LAB_0015b742;
    }
    if (pvVar3 == (void *)0x0) {
      pcVar6 = "!=";
      pcVar8 = "!=";
      lVar4 = 0;
      eval_a = 0;
      pcVar7 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar5 = "connect_req";
      uVar2 = 0x52;
      goto LAB_0015b827;
    }
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&client);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar5 = "r";
      uVar2 = 0x55;
      goto LAB_0015b742;
    }
    iVar1 = uv_tcp_connect(pvVar3,&client,&addr,connect_cb);
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar5 = "r";
      uVar2 = 0x5b;
      goto LAB_0015b742;
    }
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    addr.sin_family = 1;
    addr.sin_port = 0;
    addr.sin_addr.s_addr = 0;
    lVar4 = (long)connection_cb_called;
    if (lVar4 == 1) {
      addr.sin_family = 1;
      addr.sin_port = 0;
      addr.sin_addr.s_addr = 0;
      lVar4 = (long)connect_cb_called;
      if (lVar4 == 1) {
        addr.sin_family = 2;
        addr.sin_port = 0;
        addr.sin_addr.s_addr = 0;
        lVar4 = (long)close_cb_called;
        if (lVar4 == 2) {
          uVar2 = uv_default_loop();
          uv_walk(uVar2,close_walk_cb,0);
          uv_run(uVar2,0);
          addr.sin_family = 0;
          addr.sin_port = 0;
          addr.sin_addr.s_addr = 0;
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          lVar4 = (long)iVar1;
          if (addr._0_8_ == lVar4) {
            uv_library_shutdown();
            return 0;
          }
          pcVar7 = "uv_loop_close(uv_default_loop())";
          pcVar5 = "0";
          uVar2 = 0x6b;
          eval_a = addr._0_8_;
        }
        else {
          pcVar7 = "close_cb_called";
          pcVar5 = "2";
          uVar2 = 0x69;
          eval_a = addr._0_8_;
        }
      }
      else {
        pcVar7 = "connect_cb_called";
        pcVar5 = "1";
        uVar2 = 0x68;
        eval_a = addr._0_8_;
      }
    }
    else {
      pcVar7 = "connection_cb_called";
      pcVar5 = "1";
      uVar2 = 0x67;
      eval_a = addr._0_8_;
    }
  }
  else {
    pcVar5 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar2 = 0x33;
LAB_0015b742:
    pcVar7 = "0";
    lVar4 = 0;
  }
  pcVar8 = "==";
  pcVar6 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0015b827:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-multiple-listen.c"
          ,uVar2,pcVar5,pcVar6,pcVar7,eval_a,pcVar8,lVar4);
  abort();
}

Assistant:

static void start_server(void) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, 128, connection_cb);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, 128, connection_cb);
  ASSERT_OK(r);
}